

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qshareddata.h
# Opt level: O0

void __thiscall
QSharedDataPointer<QStyleSheetOutlineData>::detach_helper
          (QSharedDataPointer<QStyleSheetOutlineData> *this)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  QStyleSheetOutlineData *pQVar3;
  int in_ECX;
  void *in_RDX;
  __fn *in_RSI;
  QSharedDataPointer<QStyleSheetOutlineData> *in_RDI;
  void *in_R8;
  QStyleSheetOutlineData *x;
  
  iVar2 = clone(in_RDI,in_RSI,in_RDX,in_ECX,in_R8);
  QBasicAtomicInteger<int>::ref((QBasicAtomicInteger<int> *)0x46632b);
  Qt::totally_ordered_wrapper<QStyleSheetOutlineData_*>::get(&in_RDI->d);
  bVar1 = QBasicAtomicInteger<int>::deref((QBasicAtomicInteger<int> *)0x46633d);
  if ((!bVar1) &&
     (pQVar3 = Qt::totally_ordered_wrapper<QStyleSheetOutlineData_*>::get(&in_RDI->d),
     pQVar3 != (QStyleSheetOutlineData *)0x0)) {
    QStyleSheetOutlineData::~QStyleSheetOutlineData((QStyleSheetOutlineData *)0x466360);
    operator_delete(pQVar3,0x80);
  }
  Qt::totally_ordered_wrapper<QStyleSheetOutlineData_*>::reset
            (&in_RDI->d,(QStyleSheetOutlineData *)CONCAT44(extraout_var,iVar2));
  return;
}

Assistant:

Q_OUTOFLINE_TEMPLATE void QSharedDataPointer<T>::detach_helper()
{
    T *x = clone();
    x->ref.ref();
    if (!d.get()->ref.deref())
        delete d.get();
    d.reset(x);
}